

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError GropeDevice(snd_pcm_t *pcm,int isPlug,StreamDirection mode,int openBlocking,
                   PaAlsaDeviceInfo *devInfo)

{
  double dVar1;
  snd_pcm_uframes_t sVar2;
  snd_pcm_t *psVar3;
  int iVar4;
  int iVar5;
  pthread_t pVar6;
  char *pcVar7;
  size_t __n;
  long lVar8;
  long lVar9;
  long *__s;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uStack_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  int local_b8;
  int local_b4;
  int __pa_unsure_error_id_9;
  int __pa_unsure_error_id_8;
  int __pa_unsure_error_id_7;
  int __pa_unsure_error_id_6;
  int __pa_unsure_error_id_5;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  uint sampleRate;
  size_t __alsa_alloca_size;
  int __pa_unsure_error_id;
  int dir;
  double defaultSr;
  double *defaultSampleRate;
  double *defaultHighLatency;
  double *defaultLowLatency;
  int *maxChannels;
  int *minChannels;
  uint maxChans;
  uint minChans;
  snd_pcm_uframes_t alsaPeriodFrames;
  snd_pcm_uframes_t alsaBufferFrames;
  snd_pcm_hw_params_t *hwParams;
  PaAlsaDeviceInfo *pPStack_28;
  PaError result;
  PaAlsaDeviceInfo *devInfo_local;
  StreamDirection local_18;
  int openBlocking_local;
  StreamDirection mode_local;
  int isPlug_local;
  snd_pcm_t *pcm_local;
  
  __s = &local_108;
  hwParams._4_4_ = 0;
  defaultSr = (double)&(devInfo->baseDeviceInfo).defaultSampleRate;
  ___pa_unsure_error_id = *(double *)defaultSr;
  pPStack_28 = devInfo;
  devInfo_local._4_4_ = openBlocking;
  local_18 = mode;
  openBlocking_local = isPlug;
  _mode_local = pcm;
  if (pcm == (snd_pcm_t *)0x0) {
    uStack_110 = 0x10cc44;
    __assert_fail("pcm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x34f,
                  "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)")
    ;
  }
  if (mode == StreamDirection_In) {
    maxChannels = &devInfo->minInputChannels;
    defaultLowLatency = (double *)&(devInfo->baseDeviceInfo).maxInputChannels;
    defaultHighLatency = &(devInfo->baseDeviceInfo).defaultLowInputLatency;
    defaultSampleRate = &(devInfo->baseDeviceInfo).defaultHighInputLatency;
  }
  else {
    maxChannels = &devInfo->minOutputChannels;
    defaultLowLatency = (double *)&(devInfo->baseDeviceInfo).maxOutputChannels;
    defaultHighLatency = &(devInfo->baseDeviceInfo).defaultLowOutputLatency;
    defaultSampleRate = &(devInfo->baseDeviceInfo).defaultHighOutputLatency;
  }
  uStack_110 = 0x10ccbe;
  __alsa_alloca_size._0_4_ = (*(code *)alsa_snd_pcm_nonblock)(pcm);
  if ((int)__alsa_alloca_size < 0) {
    uStack_110 = 0x10ccd9;
    pVar6 = pthread_self();
    uStack_110 = 0x10cceb;
    iVar4 = pthread_equal(pVar6,paUnixMainThread);
    if (iVar4 != 0) {
      local_c0 = (long)(int)__alsa_alloca_size;
      uStack_110 = 0x10cd07;
      pcVar7 = (*alsa_snd_strerror)((int)__alsa_alloca_size);
      uStack_110 = 0x10cd1b;
      PaUtil_SetLastHostErrorInfo(paALSA,local_c0,pcVar7);
    }
    uStack_110 = 0x10cd29;
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_nonblock( pcm, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 866\n"
                     );
  }
  else {
    uStack_110 = 0x10cd42;
    __n = (*(code *)alsa_snd_pcm_hw_params_sizeof)();
    lVar9 = -(__n + 0xf & 0xfffffffffffffff0);
    __s = (long *)((long)&local_108 + lVar9);
    ___pa_unsure_error_id_1 = __n;
    alsaBufferFrames = (snd_pcm_uframes_t)__s;
    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cd77;
    memset(__s,0,__n);
    psVar3 = _mode_local;
    sVar2 = alsaBufferFrames;
    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cd88;
    (*(code *)alsa_snd_pcm_hw_params_any)(psVar3,sVar2);
    psVar3 = _mode_local;
    sVar2 = alsaBufferFrames;
    dVar1 = ___pa_unsure_error_id;
    if (0.0 <= ___pa_unsure_error_id) {
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cda8;
      iVar4 = SetApproximateSampleRate(psVar3,(snd_pcm_hw_params_t *)sVar2,dVar1);
      psVar3 = _mode_local;
      sVar2 = alsaBufferFrames;
      if (iVar4 < 0) {
        ___pa_unsure_error_id = -1.0;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cdcb;
        (*(code *)alsa_snd_pcm_hw_params_any)(psVar3,sVar2);
      }
    }
    psVar3 = _mode_local;
    sVar2 = alsaBufferFrames;
    if (0.0 <= ___pa_unsure_error_id) {
LAB_0010ceb6:
      sVar2 = alsaBufferFrames;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cec9;
      __pa_unsure_error_id_4 =
           (*(code *)alsa_snd_pcm_hw_params_get_channels_min)(sVar2,(long)&minChannels + 4);
      sVar2 = alsaBufferFrames;
      if (__pa_unsure_error_id_4 < 0) {
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cee7;
        pVar6 = pthread_self();
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cef9;
        iVar5 = pthread_equal(pVar6,paUnixMainThread);
        iVar4 = __pa_unsure_error_id_4;
        if (iVar5 != 0) {
          local_d0 = (long)__pa_unsure_error_id_4;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cf1b;
          pcVar7 = (*alsa_snd_strerror)(iVar4);
          lVar8 = local_d0;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cf2f;
          PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
        }
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cf3d;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 897\n"
                         );
      }
      else {
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cf5e;
        __pa_unsure_error_id_5 =
             (*(code *)alsa_snd_pcm_hw_params_get_channels_max)(sVar2,&minChannels);
        psVar3 = _mode_local;
        sVar2 = alsaBufferFrames;
        if (__pa_unsure_error_id_5 < 0) {
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cf7c;
          pVar6 = pthread_self();
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cf8e;
          iVar5 = pthread_equal(pVar6,paUnixMainThread);
          iVar4 = __pa_unsure_error_id_5;
          if (iVar5 != 0) {
            local_d8 = (long)__pa_unsure_error_id_5;
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cfb0;
            pcVar7 = (*alsa_snd_strerror)(iVar4);
            lVar8 = local_d8;
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cfc4;
            PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
          }
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cfd2;
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 898\n"
                           );
        }
        else {
          if (0x7fffffff < (uint)minChannels) {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d00a;
            __assert_fail("maxChans <= INT_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,899,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if ((uint)minChannels == 0) {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d031;
            __assert_fail("maxChans > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,900,
                          "PaError GropeDevice(snd_pcm_t *, int, StreamDirection, int, PaAlsaDeviceInfo *)"
                         );
          }
          if ((openBlocking_local != 0) && (0x80 < (uint)minChannels)) {
            minChannels._0_4_ = 0x80;
          }
          alsaPeriodFrames = 0x200;
          _maxChans = 0x80;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d06c;
          __pa_unsure_error_id_6 =
               (*(code *)alsa_snd_pcm_hw_params_set_buffer_size_near)
                         (psVar3,sVar2,&alsaPeriodFrames);
          psVar3 = _mode_local;
          sVar2 = alsaBufferFrames;
          if (__pa_unsure_error_id_6 < 0) {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d08a;
            pVar6 = pthread_self();
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d09c;
            iVar5 = pthread_equal(pVar6,paUnixMainThread);
            iVar4 = __pa_unsure_error_id_6;
            if (iVar5 != 0) {
              local_e0 = (long)__pa_unsure_error_id_6;
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d0be;
              pcVar7 = (*alsa_snd_strerror)(iVar4);
              lVar8 = local_e0;
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d0d2;
              PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
            }
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d0e0;
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 922\n"
                             );
          }
          else {
            *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d109;
            __pa_unsure_error_id_7 =
                 (*alsa_snd_pcm_hw_params_set_period_size_near)
                           (psVar3,(snd_pcm_hw_params_t *)sVar2,(snd_pcm_uframes_t *)&maxChans,
                            (int *)((long)&__alsa_alloca_size + 4));
            psVar3 = _mode_local;
            sVar2 = alsaBufferFrames;
            if (__pa_unsure_error_id_7 < 0) {
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d127;
              pVar6 = pthread_self();
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d139;
              iVar5 = pthread_equal(pVar6,paUnixMainThread);
              iVar4 = __pa_unsure_error_id_7;
              if (iVar5 != 0) {
                local_e8 = (long)__pa_unsure_error_id_7;
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d15b;
                pcVar7 = (*alsa_snd_strerror)(iVar4);
                lVar8 = local_e8;
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d16f;
                PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
              }
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d17d;
              PaUtil_DebugPrint(
                               "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 923\n"
                               );
            }
            else {
              lVar8 = alsaPeriodFrames - _maxChans;
              auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
              auVar10._0_8_ = lVar8;
              auVar10._12_4_ = 0x45300000;
              *defaultHighLatency =
                   ((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                   ___pa_unsure_error_id;
              alsaPeriodFrames = 0x800;
              _maxChans = 0x200;
              *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d1eb;
              __pa_unsure_error_id_8 = (*(code *)alsa_snd_pcm_hw_params_any)(psVar3,sVar2);
              psVar3 = _mode_local;
              sVar2 = alsaBufferFrames;
              dVar1 = ___pa_unsure_error_id;
              if (__pa_unsure_error_id_8 < 0) {
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d209;
                pVar6 = pthread_self();
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d21b;
                iVar5 = pthread_equal(pVar6,paUnixMainThread);
                iVar4 = __pa_unsure_error_id_8;
                if (iVar5 != 0) {
                  local_f0 = (long)__pa_unsure_error_id_8;
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d23d;
                  pcVar7 = (*alsa_snd_strerror)(iVar4);
                  lVar8 = local_f0;
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d251;
                  PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                }
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d25f;
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_hw_params_any( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 930\n"
                                 );
              }
              else {
                *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d281;
                __pa_unsure_error_id_9 =
                     SetApproximateSampleRate(psVar3,(snd_pcm_hw_params_t *)sVar2,dVar1);
                psVar3 = _mode_local;
                sVar2 = alsaBufferFrames;
                if (__pa_unsure_error_id_9 < 0) {
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d29f;
                  pVar6 = pthread_self();
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d2b1;
                  iVar5 = pthread_equal(pVar6,paUnixMainThread);
                  iVar4 = __pa_unsure_error_id_9;
                  if (iVar5 != 0) {
                    local_f8 = (long)__pa_unsure_error_id_9;
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d2d3;
                    pcVar7 = (*alsa_snd_strerror)(iVar4);
                    lVar8 = local_f8;
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d2e7;
                    PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                  }
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d2f5;
                  PaUtil_DebugPrint(
                                   "Expression \'SetApproximateSampleRate( pcm, hwParams, defaultSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 931\n"
                                   );
                }
                else {
                  *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d31a;
                  local_b4 = (*(code *)alsa_snd_pcm_hw_params_set_buffer_size_near)
                                       (psVar3,sVar2,&alsaPeriodFrames);
                  psVar3 = _mode_local;
                  sVar2 = alsaBufferFrames;
                  if (local_b4 < 0) {
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d338;
                    pVar6 = pthread_self();
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d34a;
                    iVar5 = pthread_equal(pVar6,paUnixMainThread);
                    iVar4 = local_b4;
                    if (iVar5 != 0) {
                      local_100 = (long)local_b4;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d36c;
                      pcVar7 = (*alsa_snd_strerror)(iVar4);
                      lVar8 = local_100;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d380;
                      PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                    }
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d38e;
                    PaUtil_DebugPrint(
                                     "Expression \'alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 932\n"
                                     );
                  }
                  else {
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d3b7;
                    local_b8 = (*alsa_snd_pcm_hw_params_set_period_size_near)
                                         (psVar3,(snd_pcm_hw_params_t *)sVar2,
                                          (snd_pcm_uframes_t *)&maxChans,
                                          (int *)((long)&__alsa_alloca_size + 4));
                    if (-1 < local_b8) {
                      lVar9 = alsaPeriodFrames - _maxChans;
                      auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
                      auVar11._0_8_ = lVar9;
                      auVar11._12_4_ = 0x45300000;
                      *defaultSampleRate =
                           ((auVar11._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                           ___pa_unsure_error_id;
                      *maxChannels = minChannels._4_4_;
                      *(uint *)defaultLowLatency = (uint)minChannels;
                      *(double *)defaultSr = ___pa_unsure_error_id;
                      goto LAB_0010d494;
                    }
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d3d5;
                    pVar6 = pthread_self();
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d3e7;
                    iVar5 = pthread_equal(pVar6,paUnixMainThread);
                    iVar4 = local_b8;
                    if (iVar5 != 0) {
                      local_108 = (long)local_b8;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d409;
                      pcVar7 = (*alsa_snd_strerror)(iVar4);
                      lVar8 = local_108;
                      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d41d;
                      PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
                    }
                    *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10d42b;
                    PaUtil_DebugPrint(
                                     "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 933\n"
                                     );
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      __pa_unsure_error_id_2 = 0xac44;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cdf8;
      (*(code *)alsa_snd_pcm_hw_params_set_rate_resample)(psVar3,sVar2,0);
      psVar3 = _mode_local;
      sVar2 = alsaBufferFrames;
      *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10ce12;
      iVar4 = (*(code *)alsa_snd_pcm_hw_params_set_rate_near)
                        (psVar3,sVar2,&__pa_unsure_error_id_2,0);
      sVar2 = alsaBufferFrames;
      if (-1 < iVar4) {
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10ce32;
        __pa_unsure_error_id_3 =
             GetExactSampleRate((snd_pcm_hw_params_t *)sVar2,(double *)&__pa_unsure_error_id);
        if (-1 < __pa_unsure_error_id_3) goto LAB_0010ceb6;
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10ce50;
        pVar6 = pthread_self();
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10ce62;
        iVar5 = pthread_equal(pVar6,paUnixMainThread);
        iVar4 = __pa_unsure_error_id_3;
        if (iVar5 != 0) {
          local_c8 = (long)__pa_unsure_error_id_3;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10ce84;
          pcVar7 = (*alsa_snd_strerror)(iVar4);
          lVar8 = local_c8;
          *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10ce98;
          PaUtil_SetLastHostErrorInfo(paALSA,lVar8,pcVar7);
        }
        *(undefined8 *)((long)&uStack_110 + lVar9) = 0x10cea6;
        PaUtil_DebugPrint(
                         "Expression \'GetExactSampleRate( hwParams, &defaultSr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 894\n"
                         );
      }
    }
  }
  hwParams._4_4_ = -9999;
LAB_0010d494:
  psVar3 = _mode_local;
  *(undefined8 *)((long)__s + -8) = 0x10d4a1;
  (*(code *)alsa_snd_pcm_close)(psVar3);
  return hwParams._4_4_;
}

Assistant:

static PaError GropeDevice( snd_pcm_t* pcm, int isPlug, StreamDirection mode, int openBlocking,
        PaAlsaDeviceInfo* devInfo )
{
    PaError result = paNoError;
    snd_pcm_hw_params_t *hwParams;
    snd_pcm_uframes_t alsaBufferFrames, alsaPeriodFrames;
    unsigned int minChans, maxChans;
    int* minChannels, * maxChannels;
    double * defaultLowLatency, * defaultHighLatency, * defaultSampleRate =
        &devInfo->baseDeviceInfo.defaultSampleRate;
    double defaultSr = *defaultSampleRate;
    int dir;

    assert( pcm );

    PA_DEBUG(( "%s: collecting info ..\n", __FUNCTION__ ));

    if( StreamDirection_In == mode )
    {
        minChannels = &devInfo->minInputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxInputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowInputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighInputLatency;
    }
    else
    {
        minChannels = &devInfo->minOutputChannels;
        maxChannels = &devInfo->baseDeviceInfo.maxOutputChannels;
        defaultLowLatency = &devInfo->baseDeviceInfo.defaultLowOutputLatency;
        defaultHighLatency = &devInfo->baseDeviceInfo.defaultHighOutputLatency;
    }

    ENSURE_( alsa_snd_pcm_nonblock( pcm, 0 ), paUnanticipatedHostError );

    alsa_snd_pcm_hw_params_alloca( &hwParams );
    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    if( defaultSr >= 0 )
    {
        /* Could be that the device opened in one mode supports samplerates that the other mode wont have,
         * so try again .. */
        if( SetApproximateSampleRate( pcm, hwParams, defaultSr ) < 0 )
        {
            defaultSr = -1.;
            alsa_snd_pcm_hw_params_any( pcm, hwParams ); /* Clear any params (rate) that might have been set */
            PA_DEBUG(( "%s: Original default samplerate failed, trying again ..\n", __FUNCTION__ ));
        }
    }

    if( defaultSr < 0. )           /* Default sample rate not set */
    {
        unsigned int sampleRate = 44100;        /* Will contain approximate rate returned by alsa-lib */

        /* Don't allow rate resampling when probing for the default rate (but ignore if this call fails) */
        alsa_snd_pcm_hw_params_set_rate_resample( pcm, hwParams, 0 );
        if( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &sampleRate, NULL ) < 0 )
        {
            result = paUnanticipatedHostError;
            goto error;
        }
        ENSURE_( GetExactSampleRate( hwParams, &defaultSr ), paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_get_channels_min( hwParams, &minChans ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_get_channels_max( hwParams, &maxChans ), paUnanticipatedHostError );
    assert( maxChans <= INT_MAX );
    assert( maxChans > 0 );    /* Weird linking issue could cause wrong version of ALSA symbols to be called,
                                   resulting in zeroed values */

    /* XXX: Limit to sensible number (ALSA plugins accept a crazy amount of channels)? */
    if( isPlug && maxChans > 128 )
    {
        maxChans = 128;
        PA_DEBUG(( "%s: Limiting number of plugin channels to %u\n", __FUNCTION__, maxChans ));
    }

    /* TWEAKME:
     * Giving values for default min and max latency is not straightforward.
     *  * for low latency, we want to give the lowest value that will work reliably.
     *      This varies based on the sound card, kernel, CPU, etc.  Better to give
     *      sub-optimal latency than to give a number too low and cause dropouts.
     *  * for high latency we want to give a large enough value that dropouts are basically impossible.
     *      This doesn't really require as much tweaking, since providing too large a number will
     *      just cause us to select the nearest setting that will work at stream config time.
     */
    /* Try low latency values, (sometimes the buffer & period that result are larger) */
    alsaBufferFrames = 512;
    alsaPeriodFrames = 128;
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultLowLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    /* Base the high latency case on values four times larger */
    alsaBufferFrames = 2048;
    alsaPeriodFrames = 512;
    /* Have to reset hwParams, to set new buffer size; need to also set sample rate again */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );
    ENSURE_( SetApproximateSampleRate( pcm, hwParams, defaultSr ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_buffer_size_near( pcm, hwParams, &alsaBufferFrames ), paUnanticipatedHostError );
    ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( pcm, hwParams, &alsaPeriodFrames, &dir ), paUnanticipatedHostError );
    *defaultHighLatency = (double) (alsaBufferFrames - alsaPeriodFrames) / defaultSr;

    *minChannels = (int)minChans;
    *maxChannels = (int)maxChans;
    *defaultSampleRate = defaultSr;

end:
    alsa_snd_pcm_close( pcm );
    return result;

error:
    goto end;
}